

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdio_greater_than_3(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_timer_t *loop;
  int extraout_EDX;
  uv_process_t *puVar4;
  uv_timer_t *puVar5;
  code *pcVar6;
  char *handle;
  uv_stdio_container_t stdio [4];
  uv_pipe_t pipe;
  uv_os_fd_t uStack_2bc;
  sockaddr_in sStack_2b8;
  uv_stdio_container_t uStack_2a8;
  undefined4 uStack_298;
  undefined4 uStack_290;
  undefined4 uStack_288;
  undefined4 uStack_280;
  undefined4 uStack_278;
  int iStack_270;
  uv_loop_t *puStack_268;
  uv_tcp_t uStack_260;
  uv_stdio_container_t local_168;
  undefined4 local_158;
  undefined4 local_148;
  undefined4 local_138;
  uv_loop_t *local_130;
  
  uStack_260.queued_fds = (void *)0x16ab82;
  init_process_options("spawn_helper5",exit_cb);
  uStack_260.queued_fds = (void *)0x16ab87;
  puVar2 = uv_default_loop();
  puVar3 = (uv_loop_t *)&stack0xfffffffffffffee0;
  uStack_260.queued_fds = (void *)0x16ab9b;
  uv_pipe_init(puVar2,(uv_pipe_t *)puVar3,0);
  local_168.flags = UV_IGNORE;
  local_158 = 0;
  local_148 = 0;
  local_138 = 0x21;
  options.stdio_count = 4;
  uStack_260.queued_fds = (void *)0x16abce;
  options.stdio = &local_168;
  local_130 = puVar3;
  puVar2 = uv_default_loop();
  uStack_260.queued_fds = (void *)0x16abe0;
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    uStack_260.queued_fds = (void *)0x16ac00;
    iVar1 = uv_read_start((uv_stream_t *)&stack0xfffffffffffffee0,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0016acbc;
    uStack_260.queued_fds = (void *)0x16ac0d;
    puVar2 = uv_default_loop();
    uStack_260.queued_fds = (void *)0x16ac17;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016acc1;
    if (exit_cb_called != 1) goto LAB_0016acc6;
    if (close_cb_called != 2) goto LAB_0016accb;
    uStack_260.queued_fds = (void *)0x16ac4e;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT71(output._8_7_,output[7]) != 0xa216f69647473 ||
        CONCAT17(output[7],output._0_7_) != 0x7320687472756f66) goto LAB_0016acd0;
    uStack_260.queued_fds = (void *)0x16ac7a;
    puVar3 = uv_default_loop();
    uStack_260.queued_fds = (void *)0x16ac8e;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uStack_260.queued_fds = (void *)0x16ac98;
    uv_run(puVar3,UV_RUN_DEFAULT);
    uStack_260.queued_fds = (void *)0x16ac9d;
    puVar2 = uv_default_loop();
    uStack_260.queued_fds = (void *)0x16aca5;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    uStack_260.queued_fds = (void *)0x16acbc;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016acbc:
    uStack_260.queued_fds = (void *)0x16acc1;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016acc1:
    uStack_260.queued_fds = (void *)0x16acc6;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016acc6:
    uStack_260.queued_fds = (void *)0x16accb;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016accb:
    uStack_260.queued_fds = (void *)0x16acd0;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016acd0:
    uStack_260.queued_fds = (void *)0x16acd5;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStack_260.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_268 = (uv_loop_t *)0x16ace6;
  puVar2 = uv_default_loop();
  puStack_268 = (uv_loop_t *)0x16acf1;
  iVar1 = uv_tcp_init(puVar2,&uStack_260);
  if (iVar1 == 0) {
    puStack_268 = (uv_loop_t *)0x16ad02;
    iVar1 = uv_tcp_open(&uStack_260,3);
    if (iVar1 != 0) goto LAB_0016ad2b;
    puStack_268 = (uv_loop_t *)0x16ad15;
    iVar1 = uv_listen((uv_stream_t *)&uStack_260,0x1000,(uv_connection_cb)0x0);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    puStack_268 = (uv_loop_t *)0x16ad2b;
    spawn_tcp_server_helper_cold_1();
LAB_0016ad2b:
    puStack_268 = (uv_loop_t *)0x16ad30;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_268 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_268 = puVar3;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2b8);
  if (iVar1 == 0) {
    uStack_2bc = -1;
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(puVar3,&tcp_server,2);
    if (iVar1 != 0) goto LAB_0016ae96;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_2b8,0);
    if (iVar1 != 0) goto LAB_0016ae9b;
    iVar1 = uv_fileno((uv_handle_t *)&tcp_server,&uStack_2bc);
    if (iVar1 != 0) goto LAB_0016aea0;
    if (uStack_2bc < 1) goto LAB_0016aea5;
    options.stdio = &uStack_2a8;
    uStack_2a8.flags = UV_INHERIT_FD;
    uStack_2a8.data.fd = 0;
    uStack_298 = 2;
    uStack_290 = 1;
    uStack_288 = 2;
    uStack_280 = 2;
    uStack_278 = 2;
    iStack_270 = uStack_2bc;
    options.stdio_count = 4;
    puVar3 = uv_default_loop();
    iVar1 = uv_spawn(puVar3,&process,&options);
    if (iVar1 != 0) goto LAB_0016aeaa;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016aeaf;
    if (exit_cb_called != 1) goto LAB_0016aeb4;
    if (close_cb_called != 1) goto LAB_0016aeb9;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016ae96:
    run_test_spawn_tcp_server_cold_2();
LAB_0016ae9b:
    run_test_spawn_tcp_server_cold_3();
LAB_0016aea0:
    run_test_spawn_tcp_server_cold_4();
LAB_0016aea5:
    run_test_spawn_tcp_server_cold_5();
LAB_0016aeaa:
    run_test_spawn_tcp_server_cold_6();
LAB_0016aeaf:
    run_test_spawn_tcp_server_cold_7();
LAB_0016aeb4:
    run_test_spawn_tcp_server_cold_8();
LAB_0016aeb9:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar3 = uv_default_loop();
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016af70;
    if (exit_cb_called != 1) goto LAB_0016af75;
    if (close_cb_called != 1) goto LAB_0016af7a;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016af70:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016af75:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016af7a:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop = (uv_timer_t *)uv_default_loop();
  puVar4 = &process;
  iVar1 = uv_spawn((uv_loop_t *)loop,&process,&options);
  if (iVar1 == 0) {
    loop = (uv_timer_t *)uv_default_loop();
    puVar5 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)loop,&timer);
    pcVar6 = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016b057;
    loop = &timer;
    pcVar6 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_0016b05c;
    loop = (uv_timer_t *)uv_default_loop();
    pcVar6 = (code *)0x0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016b061;
    if (exit_cb_called != 1) goto LAB_0016b066;
    if (close_cb_called != 2) goto LAB_0016b06b;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcVar6 = (code *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    loop = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar6 = (code *)puVar4;
LAB_0016b057:
    run_test_spawn_and_kill_cold_2();
LAB_0016b05c:
    run_test_spawn_and_kill_cold_3();
LAB_0016b061:
    run_test_spawn_and_kill_cold_4();
LAB_0016b066:
    run_test_spawn_and_kill_cold_5();
LAB_0016b06b:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  handle = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar6 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop,close_cb);
      handle = (char *)(ulong)*(uint *)&((uv_loop_t *)loop)->watchers;
      iVar1 = uv_kill(*(uint *)&((uv_loop_t *)loop)->watchers,0);
      if (iVar1 == -3) {
        return -3;
      }
      goto LAB_0016b0ca;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016b0ca:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)handle,close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_stdio_greater_than_3) {
  int r;
  uv_pipe_t pipe;
  uv_stdio_container_t stdio[4];

  init_process_options("spawn_helper5", exit_cb);

  uv_pipe_init(uv_default_loop(), &pipe, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;
  options.stdio[3].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[3].data.stream = (uv_stream_t*)&pipe;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* Once for process once for the pipe. */
  printf("output from stdio[3] is: %s", output);
  ASSERT(strcmp("fourth stdio!\n", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}